

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QRegion __thiscall
QGraphicsItem::boundingRegion(QGraphicsItem *this,QTransform *itemToDeviceTransform)

{
  undefined8 uVar1;
  long lVar2;
  Representation RVar3;
  long lVar4;
  Representation RVar5;
  long lVar6;
  Representation RVar7;
  QPointF *in_RDX;
  undefined8 *puVar8;
  qreal *pqVar9;
  QStyleOptionGraphicsItem *pQVar10;
  QTransform *pQVar11;
  QRect *rect;
  long in_FS_OFFSET;
  byte bVar12;
  qreal qVar13;
  Representation RVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  QRect QVar19;
  undefined1 auVar20 [16];
  QRect local_178;
  QRegion local_168;
  QRect local_160;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  double local_130;
  double local_128;
  QPainter p;
  undefined1 *local_118;
  undefined1 *puStack_110;
  undefined1 *local_108;
  QSize local_100;
  QRect local_f8;
  QTransform unscale;
  QStyleOptionGraphicsItem option;
  
  bVar12 = 0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  qVar13 = boundingRegionGranularity((QGraphicsItem *)itemToDeviceTransform);
  (**(code **)((long)itemToDeviceTransform->m_matrix[0][0] + 0x18))(&unscale,itemToDeviceTransform);
  QTransform::mapRect((QRectF *)&option);
  QVar19 = QRectF::toRect((QRectF *)&option);
  RVar5 = QVar19.y2.m_i;
  RVar3 = QVar19.x1.m_i;
  local_f8 = QVar19;
  RVar7.m_i = QVar19.x2.m_i.m_i;
  if (QVar19.x2.m_i.m_i + 1 == RVar3.m_i) {
    local_f8._0_8_ = QVar19._0_8_;
    local_f8.x2.m_i = RVar3.m_i;
    local_f8.y2.m_i = RVar5.m_i;
    RVar7.m_i = RVar3.m_i;
  }
  RVar14 = QVar19.y1.m_i;
  if (RVar5.m_i + 1 == RVar14.m_i) {
    local_f8.y2.m_i = RVar14.m_i;
    RVar5.m_i = RVar14.m_i;
  }
  if ((qVar13 != 0.0) || (NAN(qVar13))) {
    uVar15 = (uint)(qVar13 * (double)((RVar7.m_i - RVar3.m_i) + 1));
    uVar16 = (uint)(qVar13 * (double)((RVar5.m_i - RVar14.m_i) + 1));
    uVar17 = -(uint)(-1 < (int)uVar15);
    uVar18 = -(uint)(-1 < (int)uVar16);
    local_100.wd.m_i = (uVar17 ^ 0xffffffff | uVar15 & uVar17) + 2;
    local_100.ht.m_i = (uVar18 ^ 0xffffffff | uVar16 & uVar18) + 2;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_110 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)&local_118,&local_100,Format_ARGB32_Premultiplied);
    QImage::fill((uint)(QImage *)&local_118);
    _p = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter(&p,(QPaintDevice *)&local_118);
    QPainter::setRenderHints((QPointF *)&p,1,1);
    option.super_QStyleOption.version = 0;
    option.super_QStyleOption.type = 0;
    option.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    option.super_QStyleOption.direction = LeftToRight;
    auVar20 = QTransform::map(in_RDX);
    local_130 = auVar20._0_8_ - (double)local_f8.x1.m_i.m_i;
    local_128 = auVar20._8_8_ - (double)local_f8.y1.m_i.m_i;
    QPainter::scale(qVar13,qVar13);
    QPainter::translate((QPointF *)&p);
    QPainter::translate(&p,1.0,1.0);
    QPainter::setWorldTransform((QTransform *)&p,SUB81(in_RDX,0));
    QTransform::inverted((bool *)&option);
    local_148 = (undefined1 *)0x0;
    puStack_140 = (undefined1 *)0x0;
    unscale.m_matrix[0]._0_16_ = QTransform::map((QPointF *)&option);
    QPainter::translate((QPointF *)&p);
    puVar8 = &DAT_00677048;
    pQVar10 = &option;
    for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
      uVar1 = *puVar8;
      (pQVar10->super_QStyleOption).version = (int)uVar1;
      (pQVar10->super_QStyleOption).type = (int)((ulong)uVar1 >> 0x20);
      puVar8 = puVar8 + (ulong)bVar12 * -2 + 1;
      pQVar10 = (QStyleOptionGraphicsItem *)((long)pQVar10 + (ulong)bVar12 * -0x10 + 8);
    }
    QStyleOptionGraphicsItem::QStyleOptionGraphicsItem(&option);
    (**(code **)((long)itemToDeviceTransform->m_matrix[0][0] + 0x50))
              (itemToDeviceTransform,(QPointF *)&p,&option,0);
    QPainter::end();
    pqVar9 = (qreal *)&DAT_00677848;
    pQVar11 = &unscale;
    for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
      pQVar11->m_matrix[0][0] = *pqVar9;
      pqVar9 = pqVar9 + (ulong)bVar12 * -2 + 1;
      pQVar11 = (QTransform *)((long)pQVar11 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    QTransform::fromScale(1.0 / qVar13,1.0 / qVar13);
    this->_vptr_QGraphicsItem = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    local_138 = &DAT_aaaaaaaaaaaaaaaa;
    local_148 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
    QImage::createMaskFromColor(&local_160,&local_118,0,0);
    QBitmap::fromImage((QBitmap *)&local_148,&local_160,0);
    QImage::~QImage((QImage *)&local_160);
    QRegion::QRegion(&local_168,(QBitmap *)&local_148);
    lVar6 = QRegion::begin();
    lVar4 = QRegion::end();
    for (; lVar6 != lVar4; lVar6 = lVar6 + 0x10) {
      QVar19 = (QRect)QTransform::mapRect((QRect *)&unscale);
      local_178._0_8_ =
           (ulong)(local_f8.x1.m_i.m_i - 1) | (local_f8._0_8_ & 0xffffffff00000000) - 0x100000000;
      local_160 = QVar19;
      QVar19 = QRect::translated(&local_160,(QPoint *)&local_178);
      auVar20._12_4_ = QVar19.y2.m_i;
      auVar20._0_4_ = (undefined4)(QVar19._0_8_ + 0xffffffff);
      auVar20._8_4_ = (undefined4)(QVar19._8_8_ + 1);
      auVar20._4_4_ = auVar20._8_4_;
      local_178._0_8_ = CONCAT44(QVar19.y1.m_i.m_i,auVar20._0_4_) + -0x100000000;
      local_178._8_8_ = auVar20._8_8_ + 0x100000000;
      QVar19 = (QRect)QRect::operator&(&local_178,&local_f8);
      local_160 = QVar19;
      QRegion::operator+=((QRegion *)this,&local_160);
    }
    QRegion::~QRegion(&local_168);
    QBitmap::~QBitmap((QBitmap *)&local_148);
    QStyleOption::~QStyleOption(&option.super_QStyleOption);
    QPainter::~QPainter(&p);
    QImage::~QImage((QImage *)&local_118);
  }
  else {
    QRegion::QRegion((QRegion *)this,&local_f8,Rectangle);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QGraphicsItem::boundingRegion(const QTransform &itemToDeviceTransform) const
{
    // ### Ideally we would have a better way to generate this region,
    // preferably something in the lines of QPainterPath::toRegion(QTransform)
    // coupled with a way to generate a painter path from a set of painter
    // operations (e.g., QPicture::toPainterPath() or so). The current
    // approach generates a bitmap with the size of the item's bounding rect
    // in device coordinates, scaled by b.r.granularity, then paints the item
    // into the bitmap, converts the result to a QRegion and scales the region
    // back to device space with inverse granularity.
    qreal granularity = boundingRegionGranularity();
    QRect deviceRect = itemToDeviceTransform.mapRect(boundingRect()).toRect();
    _q_adjustRect(&deviceRect);
    if (granularity == 0.0)
        return QRegion(deviceRect);

    int pad = 1;
    QSize bitmapSize(qMax(1, int(deviceRect.width() * granularity) + pad * 2),
                     qMax(1, int(deviceRect.height() * granularity) + pad * 2));
    QImage mask(bitmapSize, QImage::Format_ARGB32_Premultiplied);
    mask.fill(0);
    QPainter p(&mask);
    p.setRenderHints(QPainter::Antialiasing);

    // Transform painter (### this code is from QGraphicsScene::drawItemHelper
    // and doesn't work properly with perspective transformations).
    QPointF viewOrigo = itemToDeviceTransform.map(QPointF(0,  0));
    QPointF offset = viewOrigo - deviceRect.topLeft();
    p.scale(granularity, granularity);
    p.translate(offset);
    p.translate(pad, pad);
    p.setWorldTransform(itemToDeviceTransform, true);
    p.translate(itemToDeviceTransform.inverted().map(QPointF(0, 0)));

    // Render
    QStyleOptionGraphicsItem option;
    const_cast<QGraphicsItem *>(this)->paint(&p, &option, nullptr);
    p.end();

    // Transform QRegion back to device space
    QTransform unscale = QTransform::fromScale(1 / granularity, 1 / granularity);
    QRegion r;
    QBitmap colorMask = QBitmap::fromImage(mask.createMaskFromColor(0));
    for (const QRect &rect : QRegion(colorMask)) {
        QRect xrect = unscale.mapRect(rect).translated(deviceRect.topLeft() - QPoint(pad, pad));
        r += xrect.adjusted(-1, -1, 1, 1) & deviceRect;
    }
    return r;
}